

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

u32 sqlite3FkOldmask(Parse *pParse,Table *pTab)

{
  int iVar1;
  FKey *pFVar2;
  u32 uVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  long in_FS_OFFSET;
  Index *pIdx;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0;
  if (((pParse->db->flags & 0x4000) != 0) && (uVar3 = 0, pTab->eTabType == '\0')) {
    pFVar2 = (FKey *)&pTab->u;
    uVar3 = 0;
    while (pFVar2 = pFVar2->pNextFrom, pFVar2 != (FKey *)0x0) {
      uVar5 = pFVar2->nCol;
      if (pFVar2->nCol < 1) {
        uVar5 = 0;
      }
      for (lVar6 = 0; (ulong)uVar5 * 0x10 != lVar6; lVar6 = lVar6 + 0x10) {
        iVar1 = *(int *)((long)&pFVar2->aCol[0].iFrom + lVar6);
        uVar7 = 1 << ((byte)iVar1 & 0x1f);
        if (0x1f < iVar1) {
          uVar7 = 0xffffffff;
        }
        uVar3 = uVar3 | uVar7;
      }
    }
    for (pFVar2 = sqlite3FkReferences(pTab); pFVar2 != (FKey *)0x0; pFVar2 = pFVar2->pNextTo) {
      pIdx = (Index *)0x0;
      sqlite3FkLocateIndex(pParse,pTab,pFVar2,&pIdx,(int **)0x0);
      if (pIdx != (Index *)0x0) {
        for (uVar4 = 0; pIdx->nKeyCol != uVar4; uVar4 = uVar4 + 1) {
          uVar5 = 1 << ((byte)pIdx->aiColumn[uVar4] & 0x1f);
          if (0x1f < pIdx->aiColumn[uVar4]) {
            uVar5 = 0xffffffff;
          }
          uVar3 = uVar3 | uVar5;
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar3;
}

Assistant:

SQLITE_PRIVATE u32 sqlite3FkOldmask(
  Parse *pParse,                  /* Parse context */
  Table *pTab                     /* Table being modified */
){
  u32 mask = 0;
  if( pParse->db->flags&SQLITE_ForeignKeys && IsOrdinaryTable(pTab) ){
    FKey *p;
    int i;
    for(p=pTab->u.tab.pFKey; p; p=p->pNextFrom){
      for(i=0; i<p->nCol; i++) mask |= COLUMN_MASK(p->aCol[i].iFrom);
    }
    for(p=sqlite3FkReferences(pTab); p; p=p->pNextTo){
      Index *pIdx = 0;
      sqlite3FkLocateIndex(pParse, pTab, p, &pIdx, 0);
      if( pIdx ){
        for(i=0; i<pIdx->nKeyCol; i++){
          assert( pIdx->aiColumn[i]>=0 );
          mask |= COLUMN_MASK(pIdx->aiColumn[i]);
        }
      }
    }
  }
  return mask;
}